

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O3

ostream * pstore::repo::operator<<(ostream *os,linkage l)

{
  size_t sVar1;
  char *__s;
  
  if (l < (weak_odr|internal)) {
    __s = &DAT_0013fd94 + *(int *)(&DAT_0013fd94 + (ulong)l * 4);
  }
  else {
    __s = "unknown";
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  return os;
}

Assistant:

std::ostream & pstore::repo::operator<< (std::ostream & os, linkage const l) {
    char const * str = "unknown";
    switch (l) {
#define X(a)                                                                                       \
    case linkage::a: str = #a; break;
        PSTORE_REPO_LINKAGES
#undef X
    }
    return os << str;
}